

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_d3d56.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdEmuD3D0TexFilter::emulate_mthd(MthdEmuD3D0TexFilter *this)

{
  int local_14;
  int i;
  MthdEmuD3D0TexFilter *this_local;
  
  for (local_14 = 0; local_14 < 2; local_14 = local_14 + 1) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_tex_filter[local_14] =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_tex_filter[local_14]
         & 0xffffffe1 |
         (uint)((((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x3b) >> 0x3c) << 1);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_tex_filter[local_14] =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_tex_filter[local_14]
         & 0xffffe1ff |
         (uint)((((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x33) >> 0x3c) << 9);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_tex_filter[local_14] =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_tex_filter[local_14]
         & 0xffff7fff;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_tex_filter[local_14] =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_tex_filter[local_14]
         & 0xff00ffff |
         (uint)(((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x28) >> 0x39 &
                0xffU) << 0x10);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_tex_filter[local_14] =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_tex_filter[local_14]
         & 0xf7ffffff | 0x8000000;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_tex_filter[local_14] =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_tex_filter[local_14]
         & 0x7fffffff | 0x80000000;
  }
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] & 0xff7fffff |
       0x800000;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] & 0xfffeffff |
       0x10000;
  return;
}

Assistant:

void emulate_mthd() override {
		for (int i = 0; i < 2; i++) {
			insrt(exp.d3d56_tex_filter[i], 1, 4, extr(val, 1, 4));
			insrt(exp.d3d56_tex_filter[i], 9, 4, extr(val, 9, 4));
			insrt(exp.d3d56_tex_filter[i], 15, 1, 0);
			insrt(exp.d3d56_tex_filter[i], 16, 8, extrs(val, 17, 7));
			insrt(exp.d3d56_tex_filter[i], 27, 1, 1);
			insrt(exp.d3d56_tex_filter[i], 31, 1, 1);
		}
		insrt(exp.valid[1], 23, 1, 1);
		insrt(exp.valid[1], 16, 1, 1);
	}